

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O3

void __thiscall StringBased_Vector_Test::TestBody(StringBased_Vector_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pbVar3;
  char cVar4;
  bool bVar5;
  ulong uVar6;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  undefined8 uVar7;
  char *pcVar8;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> output;
  stringstream ofile;
  AssertHelper local_1e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  string local_1d0;
  vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> local_1b0;
  stringstream local_198 [16];
  long local_188 [14];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"one = three",0xb);
  cVar4 = (char)(ostream *)local_188;
  std::ios::widen((char)*(undefined8 *)(local_188[0] + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"two = four",10);
  std::ios::widen((char)*(undefined8 *)(local_188[0] + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"five = six and seven",0x14);
  std::ios::widen((char)*(undefined8 *)(local_188[0] + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::istream::seekg((long)local_198,_S_beg);
  CLI::detail::parse_ini(&local_1b0,(istream *)local_198);
  local_1e0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_1e8.data_ =
       (AssertHelperData *)
       ((long)local_1b0.
              super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_1b0.
              super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
              _M_impl.super__Vector_impl_data._M_start >> 6);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_1d0,"(size_t)3","output.size()",(unsigned_long *)&local_1e0,
             (unsigned_long *)&local_1e8);
  if ((char)local_1d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1e0);
    if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_1d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x54,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (local_1e0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_1e0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1e0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1d0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_1b0.super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_1b0.super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
      _M_impl.super__Vector_impl_data._M_start) {
LAB_00110ca9:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00110cbb:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00110ccd:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_00110ce0:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
    uVar6 = extraout_RDX;
LAB_00110cf3:
    uVar7 = 1;
LAB_00110cfe:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7,
               uVar6);
LAB_00110d0c:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
LAB_00110d1f:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
    uVar6 = extraout_RDX_00;
LAB_00110d32:
    uVar7 = 2;
LAB_00110d3d:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7,
               uVar6);
  }
  else {
    CLI::detail::ini_ret_t::name_abi_cxx11_
              (&local_1d0,
               local_1b0.
               super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
               _M_impl.super__Vector_impl_data._M_start);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&local_1e0,"\"one\"","output.at(0).name()",(char (*) [4])0x1521f2,
               &local_1d0);
    paVar1 = &local_1d0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,(char)local_1d0._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1d0._M_dataplus._M_p._1_7_,(char)local_1d0._M_dataplus._M_p));
    }
    if (local_1e0.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1d0);
      if (local_1d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar8 = "";
      }
      else {
        pcVar8 = ((local_1d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x55,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (CONCAT71(local_1d0._M_dataplus._M_p._1_7_,(char)local_1d0._M_dataplus._M_p) != 0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           ((long *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,(char)local_1d0._M_dataplus._M_p) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                         (char)local_1d0._M_dataplus._M_p) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1e0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    if (local_1b0.
        super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1b0.
        super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_00110cbb;
    local_1e8.data_ =
         (AssertHelperData *)
         ((long)((local_1b0.
                  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                  ._M_impl.super__Vector_impl_data._M_start)->inputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)((local_1b0.
                  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                  ._M_impl.super__Vector_impl_data._M_start)->inputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_1d0,"(size_t)1","output.at(0).inputs.size()",
               (unsigned_long *)&local_1e0,(unsigned_long *)&local_1e8);
    if ((char)local_1d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_1e0);
      if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)local_1d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x56,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (local_1e0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_1e0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1e0.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1d0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((local_1b0.
         super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>._M_impl
         .super__Vector_impl_data._M_finish ==
         local_1b0.
         super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>._M_impl
         .super__Vector_impl_data._M_start) ||
       (pbVar2 = ((local_1b0.
                   super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                   ._M_impl.super__Vector_impl_data._M_start)->inputs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       ((local_1b0.
         super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>._M_impl
         .super__Vector_impl_data._M_start)->inputs).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish == pbVar2)) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00110c96:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
      goto LAB_00110ca9;
    }
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)&local_1d0,"\"three\"","output.at(0).inputs.at(0)",(char (*) [6])0x15228f
               ,pbVar2);
    if ((char)local_1d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_1e0);
      if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)local_1d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x57,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (local_1e0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_1e0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1e0.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1d0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((ulong)((long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) < 2) goto LAB_00110ccd;
    CLI::detail::ini_ret_t::name_abi_cxx11_
              (&local_1d0,
               local_1b0.
               super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
               _M_impl.super__Vector_impl_data._M_start + 1);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&local_1e0,"\"two\"","output.at(1).name()",(char (*) [4])0x1523af,
               &local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,(char)local_1d0._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1d0._M_dataplus._M_p._1_7_,(char)local_1d0._M_dataplus._M_p));
    }
    if (local_1e0.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1d0);
      if (local_1d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar8 = "";
      }
      else {
        pcVar8 = ((local_1d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x58,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (CONCAT71(local_1d0._M_dataplus._M_p._1_7_,(char)local_1d0._M_dataplus._M_p) != 0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           ((long *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,(char)local_1d0._M_dataplus._M_p) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                         (char)local_1d0._M_dataplus._M_p) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1e0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    if ((ulong)((long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) < 2) goto LAB_00110ce0;
    local_1e8.data_ =
         (AssertHelperData *)
         ((long)local_1b0.
                super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
                _M_impl.super__Vector_impl_data._M_start[1].inputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1b0.
                super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
                _M_impl.super__Vector_impl_data._M_start[1].inputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_1d0,"(size_t)1","output.at(1).inputs.size()",
               (unsigned_long *)&local_1e0,(unsigned_long *)&local_1e8);
    if ((char)local_1d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_1e0);
      if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)local_1d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x59,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (local_1e0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_1e0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1e0.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1d0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar6 = (long)local_1b0.
                  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1b0.
                  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 6;
    if (uVar6 < 2) goto LAB_00110cf3;
    pbVar2 = local_1b0.
             super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
             _M_impl.super__Vector_impl_data._M_start[1].inputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_1b0.
        super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>._M_impl.
        super__Vector_impl_data._M_start[1].inputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == pbVar2) {
      uVar7 = 0;
      uVar6 = 0;
      goto LAB_00110cfe;
    }
    testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
              ((internal *)&local_1d0,"\"four\"","output.at(1).inputs.at(0)",(char (*) [5])0x15229b,
               pbVar2);
    if ((char)local_1d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_1e0);
      if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)local_1d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x5a,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (local_1e0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_1e0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1e0.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1d0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((ulong)((long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) < 3) goto LAB_00110d0c;
    CLI::detail::ini_ret_t::name_abi_cxx11_
              (&local_1d0,
               local_1b0.
               super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
               _M_impl.super__Vector_impl_data._M_start + 2);
    testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
              ((internal *)&local_1e0,"\"five\"","output.at(2).name()",(char (*) [5])0x152981,
               &local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,(char)local_1d0._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1d0._M_dataplus._M_p._1_7_,(char)local_1d0._M_dataplus._M_p));
    }
    if (local_1e0.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1d0);
      if (local_1d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar8 = "";
      }
      else {
        pcVar8 = ((local_1d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x5b,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (CONCAT71(local_1d0._M_dataplus._M_p._1_7_,(char)local_1d0._M_dataplus._M_p) != 0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           ((long *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,(char)local_1d0._M_dataplus._M_p) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                         (char)local_1d0._M_dataplus._M_p) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1e0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
    if ((ulong)((long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1b0.
                      super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) < 3) goto LAB_00110d1f;
    local_1e8.data_ =
         (AssertHelperData *)
         ((long)local_1b0.
                super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
                _M_impl.super__Vector_impl_data._M_start[2].inputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1b0.
                super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
                _M_impl.super__Vector_impl_data._M_start[2].inputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_1d0,"(size_t)3","output.at(2).inputs.size()",
               (unsigned_long *)&local_1e0,(unsigned_long *)&local_1e8);
    if ((char)local_1d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_1e0);
      if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)local_1d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x5c,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (local_1e0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_1e0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1e0.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1d0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar6 = (long)local_1b0.
                  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1b0.
                  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 6;
    if (uVar6 < 3) goto LAB_00110d32;
    pbVar2 = local_1b0.
             super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
             _M_impl.super__Vector_impl_data._M_start[2].inputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_1b0.
        super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>._M_impl.
        super__Vector_impl_data._M_start[2].inputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == pbVar2) {
      uVar7 = 0;
      uVar6 = 0;
      goto LAB_00110d3d;
    }
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&local_1d0,"\"six\"","output.at(2).inputs.at(0)",(char (*) [4])"six",
               pbVar2);
    if ((char)local_1d0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_1e0);
      if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)local_1d0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                 ,0x5d,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      if (local_1e0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_1e0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1e0.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1d0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (2 < (ulong)((long)local_1b0.
                          super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1b0.
                          super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 6)) {
      pbVar3 = local_1b0.
               super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>.
               _M_impl.super__Vector_impl_data._M_start[2].inputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)local_1b0.
                        super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].inputs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) < 2) {
        uVar7 = 1;
        goto LAB_00110d57;
      }
      testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                ((internal *)&local_1d0,"\"and\"","output.at(2).inputs.at(1)",(char (*) [4])0x153077
                 ,pbVar3 + 1);
      if ((char)local_1d0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_1e0);
        if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)local_1d0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                   ,0x5e,pcVar8);
        testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
        testing::internal::AssertHelper::~AssertHelper(&local_1e8);
        if (local_1e0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) &&
             (local_1e0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_1e0.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_1d0._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (2 < (ulong)((long)local_1b0.
                            super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1b0.
                            super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 6)) {
        pbVar3 = local_1b0.
                 super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].inputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (2 < (ulong)((long)local_1b0.
                              super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                              ._M_impl.super__Vector_impl_data._M_start[2].inputs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5)) {
          testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
                    ((internal *)&local_1d0,"\"seven\"","output.at(2).inputs.at(2)",
                     (char (*) [6])0x1522af,pbVar3 + 2);
          if ((char)local_1d0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_1e0);
            if ((undefined8 *)local_1d0._M_string_length == (undefined8 *)0x0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = *(char **)local_1d0._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_1e8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
                       ,0x5f,pcVar8);
            testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1e0);
            testing::internal::AssertHelper::~AssertHelper(&local_1e8);
            if (local_1e0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar5 = testing::internal::IsTrue(true);
              if ((bVar5) &&
                 (local_1e0.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_1e0.ptr_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1d0._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          CLI::std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::~vector
                    (&local_1b0);
          std::__cxx11::stringstream::~stringstream(local_198);
          std::ios_base::~ios_base(local_118);
          return;
        }
      }
      goto LAB_00110c96;
    }
  }
  uVar7 = 2;
LAB_00110d57:
  uVar7 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar7);
  __clang_call_terminate(uVar7);
}

Assistant:

TEST(StringBased, Vector) {
    std::stringstream ofile;

    ofile << "one = three" << std::endl;
    ofile << "two = four" << std::endl;
    ofile << "five = six and seven" << std::endl;

    ofile.seekg(0, std::ios::beg);

    auto output = CLI::detail::parse_ini(ofile);

    EXPECT_EQ((size_t)3, output.size());
    EXPECT_EQ("one", output.at(0).name());
    EXPECT_EQ((size_t)1, output.at(0).inputs.size());
    EXPECT_EQ("three", output.at(0).inputs.at(0));
    EXPECT_EQ("two", output.at(1).name());
    EXPECT_EQ((size_t)1, output.at(1).inputs.size());
    EXPECT_EQ("four", output.at(1).inputs.at(0));
    EXPECT_EQ("five", output.at(2).name());
    EXPECT_EQ((size_t)3, output.at(2).inputs.size());
    EXPECT_EQ("six", output.at(2).inputs.at(0));
    EXPECT_EQ("and", output.at(2).inputs.at(1));
    EXPECT_EQ("seven", output.at(2).inputs.at(2));
}